

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownInFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  PhysicalType PVar1;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var2;
  const_reference col_idx;
  bool bVar3;
  BoundOperatorExpression *pBVar4;
  reference pvVar5;
  pointer pEVar6;
  BoundColumnRefExpression *pBVar7;
  BoundConstantExpression *pBVar8;
  ulong uVar9;
  ConstantFilter *pCVar10;
  BoundConstantExpression *pBVar11;
  reference pvVar12;
  ConstantFilter *this_01;
  OptionalFilter *this_02;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> this_03;
  pointer pOVar13;
  pointer *__ptr;
  FilterPushdownResult FVar14;
  size_type sVar15;
  vector<duckdb::Value,_true> in_list;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_c8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_c0;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_b8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_b0;
  vector<duckdb::Value,_true> local_a8;
  const_reference local_88;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_80;
  Value local_78;
  
  if ((expr->super_BaseExpression).type != COMPARE_IN) {
    return NO_PUSHDOWN;
  }
  pBVar4 = BaseExpression::Cast<duckdb::BoundOperatorExpression>(&expr->super_BaseExpression);
  this_00 = &pBVar4->children;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_00,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if ((pEVar6->super_BaseExpression).expression_class != BOUND_COLUMN_REF) {
    return NO_PUSHDOWN;
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_00,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  pBVar7 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar6->super_BaseExpression);
  local_88 = vector<duckdb::ColumnIndex,_true>::operator[]
                       (column_ids,(pBVar7->binding).column_index);
  if (8 < (ulong)((long)(pBVar4->children).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pBVar4->children).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    sVar15 = 1;
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this_00,sVar15);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      if ((pEVar6->super_BaseExpression).type != VALUE_CONSTANT) {
        return NO_PUSHDOWN;
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this_00,sVar15);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar6->super_BaseExpression);
      if ((pBVar8->value).is_null != false) {
        return NO_PUSHDOWN;
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 < (ulong)((long)(pBVar4->children).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pBVar4->children).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_00,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar6->super_BaseExpression);
  uVar9 = (long)(pBVar4->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pBVar4->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar9 == 0x10) {
    bVar3 = TypeIsNumeric((pBVar8->value).type_.physical_type_);
    if (((bVar3) || (PVar1 = (pBVar8->value).type_.physical_type_, PVar1 == BOOL)) ||
       (PVar1 == VARCHAR)) {
      pCVar10 = (ConstantFilter *)operator_new(0x50);
      Value::Value(&local_78,&pBVar8->value);
      ConstantFilter::ConstantFilter(pCVar10,COMPARE_BOUNDARY_START,&local_78);
      Value::~Value(&local_78);
      local_80._M_head_impl = (TableFilter *)pCVar10;
      TableFilterSet::PushFilter
                (table_filters,local_88,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_80);
      if ((ConstantFilter *)local_80._M_head_impl == (ConstantFilter *)0x0) {
        return PUSHED_DOWN_FULLY;
      }
      (*((TableFilter *)&(local_80._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
      return PUSHED_DOWN_FULLY;
    }
    uVar9 = (long)(pBVar4->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar4->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (8 < uVar9) {
    sVar15 = 1;
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this_00,sVar15);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pBVar11 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar6->super_BaseExpression)
      ;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8,&pBVar11->value)
      ;
      sVar15 = sVar15 + 1;
    } while (sVar15 < (ulong)((long)(pBVar4->children).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pBVar4->children).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  bVar3 = LogicalType::IsIntegral(&(pBVar8->value).type_);
  if ((bVar3) && (bVar3 = IsDenseRange(&local_a8), bVar3)) {
    pvVar12 = vector<duckdb::Value,_true>::front(&local_a8);
    pCVar10 = (ConstantFilter *)operator_new(0x50);
    Value::Value(&local_78,pvVar12);
    ConstantFilter::ConstantFilter(pCVar10,COMPARE_GREATERTHANOREQUALTO,&local_78);
    Value::~Value(&local_78);
    pvVar12 = vector<duckdb::Value,_true>::back(&local_a8);
    this_01 = (ConstantFilter *)operator_new(0x50);
    Value::Value(&local_78,pvVar12);
    ConstantFilter::ConstantFilter(this_01,COMPARE_LESSTHANOREQUALTO,&local_78);
    Value::~Value(&local_78);
    col_idx = local_88;
    local_b0._M_head_impl = (TableFilter *)pCVar10;
    TableFilterSet::PushFilter
              (table_filters,local_88,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_b0);
    if ((ConstantFilter *)local_b0._M_head_impl != (ConstantFilter *)0x0) {
      (*((TableFilter *)&(local_b0._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
    }
    local_b0._M_head_impl = (TableFilter *)0x0;
    local_b8._M_head_impl = (TableFilter *)this_01;
    TableFilterSet::PushFilter
              (table_filters,col_idx,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_b8);
    if ((ConstantFilter *)local_b8._M_head_impl != (ConstantFilter *)0x0) {
      (*((TableFilter *)&(local_b8._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
    }
    local_b8._M_head_impl = (TableFilter *)0x0;
    FVar14 = PUSHED_DOWN_FULLY;
  }
  else {
    this_02 = (OptionalFilter *)operator_new(0x18);
    local_78.type_._0_8_ =
         (__uniq_ptr_data<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true,_true>
         )0x0;
    OptionalFilter::OptionalFilter
              (this_02,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_78);
    local_c8._M_head_impl = this_02;
    if ((TableFilter *)local_78.type_._0_8_ != (TableFilter *)0x0) {
      (**(code **)(*(long *)local_78.type_._0_8_ + 8))();
    }
    this_03._M_head_impl = (TableFilter *)operator_new(0x28);
    local_78.type_._0_8_ =
         local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    InFilter::InFilter((InFilter *)this_03._M_head_impl,(vector<duckdb::Value,_true> *)&local_78);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
    pOVar13 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
              ::operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                            *)&local_c8);
    _Var2._M_head_impl =
         (pOVar13->child_filter).
         super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
         super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
    (pOVar13->child_filter).
    super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = this_03._M_head_impl;
    if (_Var2._M_head_impl != (TableFilter *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableFilter + 8))();
    }
    local_c0._M_head_impl = &(local_c8._M_head_impl)->super_TableFilter;
    local_c8._M_head_impl = (OptionalFilter *)0x0;
    TableFilterSet::PushFilter
              (table_filters,local_88,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_c0);
    if ((OptionalFilter *)local_c0._M_head_impl != (OptionalFilter *)0x0) {
      (*((TableFilter *)&(local_c0._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
    }
    local_c0._M_head_impl = (TableFilter *)0x0;
    if (local_c8._M_head_impl != (OptionalFilter *)0x0) {
      (*((local_c8._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
    }
    FVar14 = PUSHED_DOWN_PARTIALLY;
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8);
  return FVar14;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownInFilter(TableFilterSet &table_filters,
                                                         const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionType() != ExpressionType::COMPARE_IN) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &func = expr.Cast<BoundOperatorExpression>();
	D_ASSERT(func.children.size() > 1);
	if (func.children[0]->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF) {
		// we need col IN (...) to be able to push this down
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &column_ref = func.children[0]->Cast<BoundColumnRefExpression>();
	auto &column_index = column_ids[column_ref.binding.column_index];
	//! check if all children are const expr
	bool children_constant = true;
	for (size_t i {1}; i < func.children.size(); i++) {
		if (func.children[i]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			children_constant = false;
			break;
		}
		auto &const_value_expr = func.children[i]->Cast<BoundConstantExpression>();
		if (const_value_expr.value.IsNull()) {
			// cannot simplify NULL values
			children_constant = false;
			break;
		}
	}
	if (!children_constant) {
		// all children must be constant
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &fst_const_value_expr = func.children[1]->Cast<BoundConstantExpression>();
	auto &type = fst_const_value_expr.value.type();

	if (func.children.size() == 2 && TypeSupportsConstantFilter(type)) {
		// col IN (literal) is equivalent to an equality comparison - push that down
		auto bound_eq_comparison = make_uniq<ConstantFilter>(ExpressionType::COMPARE_EQUAL, fst_const_value_expr.value);
		table_filters.PushFilter(column_index, std::move(bound_eq_comparison));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}

	//! Check if values are consecutive, if yes transform them to >= <= (only for integers)
	// e.g. if we have x IN (1, 2, 3, 4, 5) we transform this into x >= 1 AND x <= 5
	vector<Value> in_list;
	for (idx_t i = 1; i < func.children.size(); i++) {
		auto &const_value_expr = func.children[i]->Cast<BoundConstantExpression>();
		D_ASSERT(!const_value_expr.value.IsNull());
		in_list.push_back(const_value_expr.value);
	}
	if (type.IsIntegral() && IsDenseRange(in_list)) {
		// dense range! turn this into x >= min AND x <= max
		// IsDenseRange sorts in_list, so the front element is the min and the back element is the max
		auto lower_bound =
		    make_uniq<ConstantFilter>(ExpressionType::COMPARE_GREATERTHANOREQUALTO, std::move(in_list.front()));
		auto upper_bound =
		    make_uniq<ConstantFilter>(ExpressionType::COMPARE_LESSTHANOREQUALTO, std::move(in_list.back()));
		table_filters.PushFilter(column_index, std::move(lower_bound));
		table_filters.PushFilter(column_index, std::move(upper_bound));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}
	// if this is not a dense range we can push an optional filter for zone-map pruning
	auto optional_filter = make_uniq<OptionalFilter>();
	auto in_filter = make_uniq<InFilter>(std::move(in_list));
	optional_filter->child_filter = std::move(in_filter);
	table_filters.PushFilter(column_index, std::move(optional_filter));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}